

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkMiterBm(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iCurrMatch,Vec_Ptr_t *oCurrMatch)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  Abc_Ntk_t *pNtk;
  char *pcVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  char Buffer [1000];
  char local_418 [1000];
  
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf(local_418,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
  pcVar10 = Extra_UtilStrsav(local_418);
  pNtk->pName = pcVar10;
  pAVar11 = Abc_AigConst1(pNtk);
  pAVar12 = Abc_AigConst1(pNtk1);
  (pAVar12->field_6).pCopy = pAVar11;
  pAVar11 = Abc_AigConst1(pNtk);
  pAVar12 = Abc_AigConst1(pNtk2);
  (pAVar12->field_6).pCopy = pAVar11;
  if (iCurrMatch == (Vec_Ptr_t *)0x0) {
    pVVar13 = pNtk1->vCis;
    if (0 < pVVar13->nSize) {
      lVar16 = 0;
      do {
        pvVar3 = pVVar13->pArray[lVar16];
        pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        *(Abc_Obj_t **)((long)pvVar3 + 0x40) = pAVar11;
        if (pNtk2->vCis->nSize <= lVar16) goto LAB_00243c15;
        pAVar12 = (Abc_Obj_t *)pNtk2->vCis->pArray[lVar16];
        (pAVar12->field_6).pCopy = pAVar11;
        pcVar10 = Abc_ObjName(pAVar12);
        Abc_ObjAssignName(pAVar11,pcVar10,(char *)0x0);
        lVar16 = lVar16 + 1;
        pVVar13 = pNtk1->vCis;
      } while (lVar16 < pVVar13->nSize);
    }
  }
  else if (0 < iCurrMatch->nSize) {
    lVar16 = 0;
    do {
      pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      if ((iCurrMatch->nSize <= lVar16) ||
         (*(Abc_Obj_t **)((long)iCurrMatch->pArray[lVar16] + 0x40) = pAVar11,
         (long)iCurrMatch->nSize <= lVar16 + 1)) goto LAB_00243c15;
      pAVar12 = (Abc_Obj_t *)iCurrMatch->pArray[lVar16 + 1];
      (pAVar12->field_6).pCopy = pAVar11;
      pcVar10 = Abc_ObjName(pAVar12);
      Abc_ObjAssignName(pAVar11,pcVar10,(char *)0x0);
      lVar16 = lVar16 + 2;
    } while ((int)lVar16 < iCurrMatch->nSize);
  }
  pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar11,"miter",(char *)0x0);
  iVar8 = Abc_NtkIsDfsOrdered(pNtk1);
  if (iVar8 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBm.c"
                  ,0x2f3,
                  "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar13 = pNtk1->vObjs;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      puVar4 = (undefined8 *)pVVar13->pArray[lVar16];
      if (puVar4 != (undefined8 *)0x0) {
        if (((ulong)puVar4 & 1) != 0) goto LAB_00243c3d;
        if (*(int *)*puVar4 != 3) goto LAB_00243c34;
        if (*(int *)((long)puVar4 + 0x1c) == 2) {
          lVar5 = *(long *)(*(long *)((int *)*puVar4 + 8) + 8);
          pAVar11 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                               (Abc_Obj_t *)
                               ((ulong)(*(uint *)((long)puVar4 + 0x14) >> 10 & 1) ^
                               *(ulong *)(*(long *)(lVar5 + (long)*(int *)puVar4[4] * 8) + 0x40)),
                               (Abc_Obj_t *)
                               ((ulong)(*(uint *)((long)puVar4 + 0x14) >> 0xb & 1) ^
                               *(ulong *)(*(long *)(lVar5 + (long)((int *)puVar4[4])[1] * 8) + 0x40)
                               ));
          puVar4[8] = pAVar11;
        }
      }
      lVar16 = lVar16 + 1;
      pVVar13 = pNtk1->vObjs;
    } while (lVar16 < pVVar13->nSize);
  }
  iVar8 = Abc_NtkIsDfsOrdered(pNtk2);
  if (iVar8 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBm.c"
                  ,0x2fc,
                  "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar13 = pNtk2->vObjs;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      puVar4 = (undefined8 *)pVVar13->pArray[lVar16];
      if (puVar4 != (undefined8 *)0x0) {
        if (((ulong)puVar4 & 1) != 0) goto LAB_00243c3d;
        if (*(int *)*puVar4 != 3) goto LAB_00243c34;
        if (*(int *)((long)puVar4 + 0x1c) == 2) {
          lVar5 = *(long *)(*(long *)((int *)*puVar4 + 8) + 8);
          pAVar11 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                               (Abc_Obj_t *)
                               ((ulong)(*(uint *)((long)puVar4 + 0x14) >> 10 & 1) ^
                               *(ulong *)(*(long *)(lVar5 + (long)*(int *)puVar4[4] * 8) + 0x40)),
                               (Abc_Obj_t *)
                               ((ulong)(*(uint *)((long)puVar4 + 0x14) >> 0xb & 1) ^
                               *(ulong *)(*(long *)(lVar5 + (long)((int *)puVar4[4])[1] * 8) + 0x40)
                               ));
          puVar4[8] = pAVar11;
        }
      }
      lVar16 = lVar16 + 1;
      pVVar13 = pNtk2->vObjs;
    } while (lVar16 < pVVar13->nSize);
  }
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  pVVar13->nCap = 100;
  pVVar13->nSize = 0;
  ppvVar14 = (void **)malloc(800);
  pVVar13->pArray = ppvVar14;
  if (oCurrMatch == (Vec_Ptr_t *)0x0) {
    pVVar15 = pNtk1->vCos;
    if (0 < pVVar15->nSize) {
      lVar16 = 0;
      do {
        plVar6 = (long *)pVVar15->pArray[lVar16];
        uVar1 = *(uint *)((long)plVar6 + 0x14);
        uVar7 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                    (long)*(int *)plVar6[4] * 8) + 0x40);
        uVar9 = pVVar13->nCap;
        if (pVVar13->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (pVVar13->pArray == (void **)0x0) {
              ppvVar14 = (void **)malloc(0x80);
            }
            else {
              ppvVar14 = (void **)realloc(pVVar13->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar9 * 2;
            if (iVar8 <= (int)uVar9) goto LAB_00243acc;
            if (pVVar13->pArray == (void **)0x0) {
              ppvVar14 = (void **)malloc((ulong)uVar9 << 4);
            }
            else {
              ppvVar14 = (void **)realloc(pVVar13->pArray,(ulong)uVar9 << 4);
            }
          }
          pVVar13->pArray = ppvVar14;
          pVVar13->nCap = iVar8;
        }
LAB_00243acc:
        iVar8 = pVVar13->nSize;
        uVar9 = iVar8 + 1;
        pVVar13->nSize = uVar9;
        pVVar13->pArray[iVar8] = (void *)(uVar1 >> 10 & 1 ^ uVar7);
        if (pNtk2->vCos->nSize <= lVar16) goto LAB_00243c15;
        plVar6 = (long *)pNtk2->vCos->pArray[lVar16];
        uVar1 = *(uint *)((long)plVar6 + 0x14);
        uVar7 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                    (long)*(int *)plVar6[4] * 8) + 0x40);
        uVar2 = pVVar13->nCap;
        if (uVar9 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar13->pArray == (void **)0x0) {
              ppvVar14 = (void **)malloc(0x80);
            }
            else {
              ppvVar14 = (void **)realloc(pVVar13->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_00243b74;
            if (pVVar13->pArray == (void **)0x0) {
              ppvVar14 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar14 = (void **)realloc(pVVar13->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar13->pArray = ppvVar14;
          pVVar13->nCap = iVar8;
        }
LAB_00243b74:
        iVar8 = pVVar13->nSize;
        pVVar13->nSize = iVar8 + 1;
        pVVar13->pArray[iVar8] = (void *)(uVar1 >> 10 & 1 ^ uVar7);
        lVar16 = lVar16 + 1;
        pVVar15 = pNtk1->vCos;
      } while (lVar16 < pVVar15->nSize);
    }
  }
  else if (0 < oCurrMatch->nSize) {
    lVar16 = 0;
    do {
      plVar6 = (long *)oCurrMatch->pArray[lVar16];
      uVar1 = *(uint *)((long)plVar6 + 0x14);
      uVar7 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                  (long)*(int *)plVar6[4] * 8) + 0x40);
      uVar9 = pVVar13->nCap;
      if (pVVar13->nSize == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar14 = (void **)malloc(0x80);
          }
          else {
            ppvVar14 = (void **)realloc(pVVar13->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar9 * 2;
          if (iVar8 <= (int)uVar9) goto LAB_00243945;
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar14 = (void **)malloc((ulong)uVar9 << 4);
          }
          else {
            ppvVar14 = (void **)realloc(pVVar13->pArray,(ulong)uVar9 << 4);
          }
        }
        pVVar13->pArray = ppvVar14;
        pVVar13->nCap = iVar8;
      }
LAB_00243945:
      iVar8 = pVVar13->nSize;
      uVar9 = iVar8 + 1;
      pVVar13->nSize = uVar9;
      pVVar13->pArray[iVar8] = (void *)(uVar1 >> 10 & 1 ^ uVar7);
      if ((long)oCurrMatch->nSize <= lVar16 + 1) goto LAB_00243c15;
      plVar6 = (long *)oCurrMatch->pArray[lVar16 + 1];
      uVar1 = *(uint *)((long)plVar6 + 0x14);
      uVar7 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                  (long)*(int *)plVar6[4] * 8) + 0x40);
      uVar2 = pVVar13->nCap;
      if (uVar9 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar14 = (void **)malloc(0x80);
          }
          else {
            ppvVar14 = (void **)realloc(pVVar13->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_002439f3;
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar14 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar14 = (void **)realloc(pVVar13->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar13->pArray = ppvVar14;
        pVVar13->nCap = iVar8;
      }
LAB_002439f3:
      iVar8 = pVVar13->nSize;
      pVVar13->nSize = iVar8 + 1;
      pVVar13->pArray[iVar8] = (void *)(uVar1 >> 10 & 1 ^ uVar7);
      lVar16 = lVar16 + 2;
    } while ((int)lVar16 < oCurrMatch->nSize);
  }
  pAVar11 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,pVVar13,0);
  if (0 < pNtk->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pNtk->vPos->pArray,pAVar11);
    if (pVVar13->pArray != (void **)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (void **)0x0;
    }
    free(pVVar13);
    return pNtk;
  }
LAB_00243c15:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_00243c3d:
  pcVar10 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_00243c44;
LAB_00243c34:
  pcVar10 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_00243c44:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterBm( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iCurrMatch, Vec_Ptr_t * oCurrMatch )
{
	char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;

	pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

	//Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );
	{
		Abc_Obj_t * pObj, * pObjNew;
		int i;

		Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
		Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

		// create new PIs and remember them in the old PIs
		if(iCurrMatch == NULL)
		{
			Abc_NtkForEachCi( pNtk1, pObj, i )
			{
				pObjNew = Abc_NtkCreatePi( pNtkMiter );
				// remember this PI in the old PIs
				pObj->pCopy = pObjNew;
				pObj = Abc_NtkCi(pNtk2, i);  
				pObj->pCopy = pObjNew;
				// add name
				Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
			}
		}
		else
		{
			for(i = 0; i < Vec_PtrSize( iCurrMatch ); i += 2)
			{
				pObjNew = Abc_NtkCreatePi( pNtkMiter );
				pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i);
				pObj->pCopy = pObjNew;
				pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i+1);
				pObj->pCopy = pObjNew;
				// add name
				Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
			}
		}

        // create the only PO
        pObjNew = Abc_NtkCreatePo( pNtkMiter );
        // add the PO name
        Abc_ObjAssignName( pObjNew, "miter", NULL );
	}

	// Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
	{
		Abc_Obj_t * pNode;
		int i;
		assert( Abc_NtkIsDfsOrdered(pNtk1) );
		Abc_AigForEachAnd( pNtk1, pNode, i )
			pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
	}

	// Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
	{
		Abc_Obj_t * pNode;
		int i;
		assert( Abc_NtkIsDfsOrdered(pNtk2) );
		Abc_AigForEachAnd( pNtk2, pNode, i )
			pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
	}
	
	// Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );	
	{
		Vec_Ptr_t * vPairs;
		Abc_Obj_t * pMiter;
		int i;

		vPairs = Vec_PtrAlloc( 100 );
	    
		// collect the CO nodes for the miter
		if(oCurrMatch != NULL)
		{
			for(i = 0; i < Vec_PtrSize( oCurrMatch ); i += 2)
			{
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i)) );
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i+1)) );
			}
		}
		else
		{
			Abc_Obj_t * pNode;

			Abc_NtkForEachCo( pNtk1, pNode, i )
			{
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
				pNode = Abc_NtkCo( pNtk2, i );
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
			}
		}
		
	 pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkMiter->pManFunc, vPairs, 0 );
	 Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );
	 Vec_PtrFree(vPairs);
	}

	//Abc_AigCleanup(pNtkMiter->pManFunc);
	
	return pNtkMiter;
}